

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_constraint.cpp
# Opt level: O3

string * __thiscall
duckdb::UniqueConstraint::GetName
          (string *__return_storage_ptr__,UniqueConstraint *this,string *table_name)

{
  pointer pbVar1;
  long lVar2;
  string *psVar3;
  char *pcVar4;
  long *plVar5;
  size_type *psVar6;
  pointer __rhs;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  string *local_80;
  string *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_80 = table_name;
  local_78 = __return_storage_ptr__;
  pcVar4 = EnumUtil::ToChars<duckdb::IndexConstraintType>(this->is_primary_key + UNIQUE);
  ::std::__cxx11::string::string((string *)&local_50,pcVar4,(allocator *)&local_a0);
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  __rhs = (this->columns).
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->columns).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__rhs != pbVar1) {
    do {
      ::std::operator+(&local_c0,"_",__rhs);
      ::std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      __rhs = __rhs + 1;
    } while (__rhs != pbVar1);
  }
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char*>((string *)local_70,local_50,local_50 + local_48);
  ::std::__cxx11::string::append((char *)local_70);
  psVar3 = local_78;
  plVar5 = (long *)::std::__cxx11::string::_M_append
                             ((char *)local_70,(ulong)(local_80->_M_dataplus)._M_p);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_c0.field_2._M_allocated_capacity = *psVar6;
    local_c0.field_2._8_8_ = plVar5[3];
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar6;
    local_c0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_c0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_a0);
  (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar6) {
    lVar2 = plVar5[3];
    (psVar3->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&psVar3->field_2 + 8) = lVar2;
  }
  else {
    (psVar3->_M_dataplus)._M_p = (pointer)*plVar5;
    (psVar3->field_2)._M_allocated_capacity = *psVar6;
  }
  psVar3->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return psVar3;
}

Assistant:

string UniqueConstraint::GetName(const string &table_name) const {
	auto type = IsPrimaryKey() ? IndexConstraintType::PRIMARY : IndexConstraintType::UNIQUE;
	auto type_name = EnumUtil::ToString(type);

	string name;
	for (const auto &column_name : GetColumnNames()) {
		name += "_" + column_name;
	}
	return type_name + "_" + table_name + name;
}